

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringbuffer.h
# Opt level: O0

void __thiscall
rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::Put
          (GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *this,Ch c)

{
  char *pcVar1;
  char in_SIL;
  Stack<rapidjson::CrtAllocator> *in_RDI;
  char *ret;
  
  if ((long)in_RDI->stackEnd_ - (long)in_RDI->stackTop_ < 1) {
    internal::Stack<rapidjson::CrtAllocator>::Expand<char>(in_RDI,(size_t)in_RDI);
  }
  pcVar1 = in_RDI->stackTop_;
  in_RDI->stackTop_ = in_RDI->stackTop_ + 1;
  *pcVar1 = in_SIL;
  return;
}

Assistant:

void Flush() {}